

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasBaseCase::iterate
          (TestStatus *__return_storage_ptr__,DepthBiasBaseCase *this)

{
  allocator<char> local_39;
  string local_38;
  DepthBiasBaseCase *local_18;
  DepthBiasBaseCase *this_local;
  
  local_18 = this;
  this_local = (DepthBiasBaseCase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Should reimplement iterate() method",&local_39);
  tcu::TestStatus::fail(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		DE_ASSERT(false);
		return tcu::TestStatus::fail("Should reimplement iterate() method");
	}